

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::EventImport::~EventImport(EventImport *this)

{
  pointer pTVar1;
  pointer pcVar2;
  
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__EventImport_001e6b40;
  pTVar1 = (this->event).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  pTVar1 = (this->event).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1);
  }
  Var::~Var(&(this->event).decl.type_var);
  pcVar2 = (this->event).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->event).name.field_2) {
    operator_delete(pcVar2);
  }
  Import::~Import((Import *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit EventImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Event>(), event(name) {}